

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngget.c
# Opt level: O2

png_uint_32
png_get_cICP(png_const_structrp png_ptr,png_const_inforp info_ptr,png_bytep colour_primaries,
            png_bytep transfer_function,png_bytep matrix_coefficients,
            png_bytep video_full_range_flag)

{
  png_uint_32 pVar1;
  int iVar2;
  undefined1 auVar3 [16];
  
  pVar1 = 0;
  if (((info_ptr != (png_const_inforp)0x0 && png_ptr != (png_const_structrp)0x0) &&
      (auVar3._0_4_ = -(uint)(colour_primaries == (png_bytep)0x0),
      auVar3._4_4_ = -(uint)(transfer_function == (png_bytep)0x0),
      auVar3._8_4_ = -(uint)(matrix_coefficients == (png_bytep)0x0),
      auVar3._12_4_ = -(uint)(video_full_range_flag == (png_bytep)0x0),
      iVar2 = movmskps((int)CONCAT71((int7)((ulong)png_ptr >> 8),png_ptr == (png_const_structrp)0x0)
                       ,auVar3), iVar2 == 0)) && ((info_ptr->valid & 0x20000) != 0)) {
    *colour_primaries = info_ptr->cicp_colour_primaries;
    *transfer_function = info_ptr->cicp_transfer_function;
    *matrix_coefficients = info_ptr->cicp_matrix_coefficients;
    *video_full_range_flag = info_ptr->cicp_video_full_range_flag;
    pVar1 = 0x20000;
  }
  return pVar1;
}

Assistant:

png_uint_32 PNGAPI
png_get_cICP(png_const_structrp png_ptr,
             png_const_inforp info_ptr, png_bytep colour_primaries,
             png_bytep transfer_function, png_bytep matrix_coefficients,
             png_bytep video_full_range_flag)
{
    png_debug1(1, "in %s retrieval function", "cICP");

    if (png_ptr != NULL && info_ptr != NULL &&
        (info_ptr->valid & PNG_INFO_cICP) != 0 &&
        colour_primaries != NULL && transfer_function != NULL &&
        matrix_coefficients != NULL && video_full_range_flag != NULL)
    {
        *colour_primaries = info_ptr->cicp_colour_primaries;
        *transfer_function = info_ptr->cicp_transfer_function;
        *matrix_coefficients = info_ptr->cicp_matrix_coefficients;
        *video_full_range_flag = info_ptr->cicp_video_full_range_flag;
        return (PNG_INFO_cICP);
    }

    return 0;
}